

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O2

int SetRoverCfgublox(UBLOX *publox)

{
  int iVar1;
  size_t __n;
  int packetlen;
  uchar local_2c8 [32];
  uchar packet [128];
  uchar sendbuf [512];
  
  packetlen = 0;
  local_2c8[0x10] = '\0';
  local_2c8[0x11] = '\0';
  local_2c8[0x12] = '\0';
  local_2c8[0x13] = '\0';
  local_2c8[0] = '\0';
  local_2c8[1] = '#';
  local_2c8[2] = '\0';
  local_2c8[3] = '\n';
  local_2c8[4] = '\0';
  local_2c8[5] = '\0';
  local_2c8[6] = '\0';
  local_2c8[7] = '\0';
  local_2c8[8] = '\0';
  local_2c8[9] = '\0';
  local_2c8[10] = '\0';
  local_2c8[0xb] = '\x01';
  local_2c8[0xc] = '\0';
  local_2c8[0xd] = '\0';
  local_2c8[0xe] = '\0';
  local_2c8[0xf] = '\0';
  EncodePacketUBX(packet,&packetlen,6,0x17,local_2c8,0x14);
  iVar1 = packetlen;
  __n = (size_t)packetlen;
  memcpy(sendbuf,packet,__n);
  iVar1 = WriteAllRS232Port(&publox->RS232Port,sendbuf,iVar1);
  if (iVar1 == 0) {
    iVar1 = 0;
    if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,__n,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
  }
  else {
    puts("Error writing data to a ublox. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int SetRoverCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[512];
	int sendbuflen = 0;
	int offset = 0;
	unsigned char packet[128];
	int packetlen = 0;
	//unsigned char cfg_msg_pl[8];
	struct CFG_NMEA_PL_UBX cfg_nmea_pl;

	//// Enable GGA, RMC NMEA messages.
	//memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	//cfg_msg_pl[0] = NMEA_STD_CLASS_UBX;
	//cfg_msg_pl[1] = NMEA_STD_GGA_ID_UBX;
	//cfg_msg_pl[3] = 4; // UART1 rate.
	//cfg_msg_pl[5] = 4; // USB rate.
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;
	//cfg_msg_pl[1] = NMEA_STD_RMC_ID_UBX;
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;

	// Set NMEA high precision mode.
	memset(&cfg_nmea_pl, 0, sizeof(cfg_nmea_pl));
	cfg_nmea_pl.nmeaVersion = NMEA_VERSION_2_3_UBX;
	cfg_nmea_pl.flags.consider = 1;
	cfg_nmea_pl.flags.highPrec = 1;
	cfg_nmea_pl.version = 1;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, LEN_CFG_NMEA_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, sizeof(cfg_nmea_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;

	//UBX-CFG-PORT set RTCM 3 as Input Protocol and UBX+NMEA(+RTCM3) as Output Protocol...
	
	sendbuflen = offset;

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}